

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_index.cpp
# Opt level: O0

bool MeCab::FeatureIndex::compile(Param *param,char *txtfile,char *binfile)

{
  char *pcVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  ostream *poVar4;
  long lVar5;
  char *in_RDX;
  ofstream ofs;
  string buf;
  string *in_stack_00000380;
  char *in_stack_00000388;
  Param *in_stack_00000390;
  die local_249;
  long local_248 [66];
  string local_38 [32];
  char *local_18;
  
  local_18 = in_RDX;
  std::__cxx11::string::string(local_38);
  convert(in_stack_00000390,in_stack_00000388,in_stack_00000380);
  pcVar1 = local_18;
  _Var3 = std::operator|(_S_bin,_S_out);
  std::ofstream::ofstream(local_248,pcVar1,_Var3);
  bVar2 = std::ios::operator_cast_to_bool
                    ((ios *)((long)local_248 + *(long *)(local_248[0] + -0x18)));
  if (!bVar2) {
    die::die(&local_249);
    poVar4 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                            );
    poVar4 = std::operator<<(poVar4,"(");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x215);
    poVar4 = std::operator<<(poVar4,") [");
    poVar4 = std::operator<<(poVar4,"ofs");
    poVar4 = std::operator<<(poVar4,"] ");
    poVar4 = std::operator<<(poVar4,"permission denied: ");
    poVar4 = std::operator<<(poVar4,local_18);
    die::operator&(&local_249,poVar4);
    die::~die((die *)0x1ec862);
  }
  lVar5 = std::__cxx11::string::data();
  std::__cxx11::string::size();
  std::ostream::write((char *)local_248,lVar5);
  std::ofstream::~ofstream(local_248);
  std::__cxx11::string::~string(local_38);
  return true;
}

Assistant:

bool FeatureIndex::compile(const Param &param,
                           const char* txtfile, const char *binfile) {
  std::string buf;
  FeatureIndex::convert(param, txtfile, &buf);
  std::ofstream ofs(WPATH(binfile), std::ios::binary|std::ios::out);
  CHECK_DIE(ofs) << "permission denied: " << binfile;
  ofs.write(buf.data(), buf.size());
  return true;
}